

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# users.h
# Opt level: O3

Index __thiscall wasm::DataFlow::Users::getNumUses(Users *this,Node *node)

{
  _Hash_node_base *p_Var1;
  bool bVar2;
  UserSet *pUVar3;
  __node_base *p_Var4;
  Index IVar5;
  _Hash_node_base *p_Var6;
  bool bVar7;
  bool bVar8;
  
  pUVar3 = getUsers(this,node);
  p_Var4 = &(pUVar3->_M_h)._M_before_begin;
  IVar5 = 0;
  do {
    p_Var4 = p_Var4->_M_nxt;
    if (p_Var4 == (__node_base *)0x0) {
      return IVar5;
    }
    p_Var6 = p_Var4[1]._M_nxt[3]._M_nxt;
    p_Var1 = p_Var4[1]._M_nxt[4]._M_nxt;
    if (p_Var6 == p_Var1) break;
    bVar2 = false;
    do {
      bVar7 = bVar2;
      bVar8 = (Node *)p_Var6->_M_nxt == node;
      IVar5 = IVar5 + bVar8;
      p_Var6 = p_Var6 + 1;
      bVar2 = (bool)(bVar7 | bVar8);
    } while (p_Var6 != p_Var1);
  } while (bVar7 || bVar8);
  __assert_fail("found",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/dataflow/users.h"
                ,0x4b,"Index wasm::DataFlow::Users::getNumUses(Node *)");
}

Assistant:

Index getNumUses(Node* node) {
    auto& users = getUsers(node);
    // A user may have more than one use
    Index numUses = 0;
    for (auto* user : users) {
#ifndef NDEBUG
      bool found = false;
#endif
      for (auto* value : user->values) {
        if (value == node) {
          numUses++;
#ifndef NDEBUG
          found = true;
#endif
        }
      }
      assert(found);
    }
    return numUses;
  }